

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O2

bool __thiscall
Rml::DecoratorText::GenerateGeometry(DecoratorText *this,Element *element,ElementData *element_data)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  Colour<unsigned_char,_255,_true> CVar8;
  FontFaceHandle FVar9;
  FontEngineInterface *pFVar10;
  ComputedValues *this_00;
  undefined4 extraout_var;
  Context *this_01;
  RenderManager *mesh;
  Colourb *pCVar11;
  size_t i;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  Vector<TexturedGeometry> textured_geometry;
  TexturedMeshList mesh_list;
  TextShapingContext text_shaping_context;
  StringView local_e8;
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float afStack_c0 [2];
  float local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [40];
  StringView local_70;
  RenderBox render_box;
  
  FVar9 = Element::GetFontFaceHandle(element);
  if (FVar9 == 0) {
    bVar14 = false;
  }
  else {
    pFVar10 = GetFontEngineInterface();
    iVar6 = (*pFVar10->_vptr_FontEngineInterface[0xb])(pFVar10,FVar9);
    bVar14 = true;
    if (iVar6 != element_data->font_handle_version) {
      this_00 = Element::GetComputedValues(element);
      text_shaping_context.language = &(this_00->inherited).language;
      text_shaping_context.text_direction =
           (Direction)((uint)*(undefined4 *)&(this_00->inherited).field_0x14 >> 0x1d) & (Rtl|Ltr);
      text_shaping_context.letter_spacing = Style::ComputedValues::letter_spacing(this_00);
      StringView::StringView(&local_70,&this->text);
      iVar6 = (*pFVar10->_vptr_FontEngineInterface[9])
                        (pFVar10,FVar9,local_70.p_begin,local_70.p_end,&text_shaping_context,0);
      iVar7 = (*pFVar10->_vptr_FontEngineInterface[8])(pFVar10,FVar9);
      Element::GetRenderBox(&render_box,element,element_data->paint_area,0);
      fVar3 = *(float *)(CONCAT44(extraout_var,iVar7) + 4);
      fVar4 = *(float *)(CONCAT44(extraout_var,iVar7) + 8);
      local_a8 = ZEXT416((uint)fVar3);
      local_c8 = render_box.border_widths._M_elems[3];
      fStack_c4 = render_box.border_radius._M_elems[0];
      afStack_c0[0] = render_box.border_radius._M_elems[1];
      afStack_c0[1] = render_box.border_radius._M_elems[2];
      local_d8 = ZEXT416((uint)render_box.border_widths._M_elems[0]);
      local_b8 = Element::ResolveNumericValue
                           (element,(this->align).x,render_box.fill_size.x - (float)iVar6);
      Element::ResolveNumericValue(element,(this->align).y,render_box.fill_size.y - (fVar4 + fVar3))
      ;
      fVar3 = (this_00->inherited).opacity;
      pCVar11 = &(this_00->inherited).color;
      if (this->inherit_color == false) {
        pCVar11 = &this->color;
      }
      local_98._0_4_ = *pCVar11;
      CVar8 = Colour<unsigned_char,255,false>::
              ToPremultiplied<std::integral_constant<bool,false>,void>
                        ((Colour<unsigned_char,255,false> *)local_98,fVar3);
      this_01 = Element::GetContext(element);
      mesh = Context::GetRenderManager(this_01);
      mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      StringView::StringView(&local_e8,&this->text);
      (*pFVar10->_vptr_FontEngineInterface[10])
                (local_b8 + local_c8 + 0.0,fVar3,pFVar10,mesh,FVar9,0,local_e8.p_begin,
                 local_e8.p_end,(ulong)(uint)CVar8,&text_shaping_context,&mesh_list);
      bVar14 = mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
               _M_impl.super__Vector_impl_data._M_start !=
               mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (bVar14) {
        ::std::
        vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ::vector(&textured_geometry,
                 (long)mesh_list.
                       super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)mesh_list.
                       super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)local_98);
        lVar13 = 0;
        uVar12 = 0;
        while( true ) {
          if ((ulong)((long)textured_geometry.
                            super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)textured_geometry.
                            super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar12) break;
          RenderManager::MakeGeometry((RenderManager *)local_98,(Mesh *)mesh);
          UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
          ::operator=((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                       *)((long)&((textured_geometry.
                                   super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->geometry).
                                 super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                                 .render_manager + lVar13),
                      (UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                       *)local_98);
          UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
          ::~UniqueRenderResource
                    ((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                      *)local_98);
          puVar1 = (undefined8 *)
                   ((long)&((mesh_list.
                             super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>
                             ._M_impl.super__Vector_impl_data._M_start)->texture).render_manager +
                   lVar13 * 2);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)
                   ((long)&((textured_geometry.
                             super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                             ._M_impl.super__Vector_impl_data._M_start)->texture).render_manager +
                   lVar13);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          uVar12 = uVar12 + 1;
          lVar13 = lVar13 + 0x20;
        }
        local_98._0_4_ = element_data->paint_area;
        local_98._8_8_ =
             textured_geometry.
             super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_98._16_8_ =
             textured_geometry.
             super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_98._24_8_ =
             textured_geometry.
             super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        textured_geometry.
        super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        textured_geometry.
        super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        textured_geometry.
        super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_98._32_4_ = (*pFVar10->_vptr_FontEngineInterface[0xb])(pFVar10,FVar9);
        ElementData::operator=(element_data,(ElementData *)local_98);
        ::std::
        vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ::~vector((vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                   *)(local_98 + 8));
        ::std::
        vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ::~vector(&textured_geometry);
      }
      ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::~vector(&mesh_list);
    }
  }
  return bVar14;
}

Assistant:

bool DecoratorText::GenerateGeometry(Element* element, ElementData& element_data) const
{
	FontFaceHandle font_face_handle = element->GetFontFaceHandle();
	if (font_face_handle == 0)
		return false;

	FontEngineInterface* font_engine_interface = GetFontEngineInterface();
	const int new_version = font_engine_interface->GetVersion(font_face_handle);
	if (new_version == element_data.font_handle_version)
		return true;

	const auto& computed = element->GetComputedValues();
	const TextShapingContext text_shaping_context{computed.language(), computed.direction(), computed.letter_spacing()};

	const int string_width = font_engine_interface->GetStringWidth(font_face_handle, text, text_shaping_context);

	const FontMetrics& metrics = font_engine_interface->GetFontMetrics(font_face_handle);
	const RenderBox render_box = element->GetRenderBox(element_data.paint_area);
	const Vector2f text_size = {float(string_width), metrics.ascent + metrics.descent};
	const Vector2f offset_to_align_area = render_box.GetFillOffset() + Vector2f{0, metrics.ascent};
	const Vector2f size_of_align_area = render_box.GetFillSize() - text_size;
	const Vector2f offset_within_align_area =
		Vector2f{element->ResolveNumericValue(align.x, size_of_align_area.x), element->ResolveNumericValue(align.y, size_of_align_area.y)};

	const Vector2f offset = offset_to_align_area + offset_within_align_area;
	const float opacity = computed.opacity();
	const ColourbPremultiplied text_color = (inherit_color ? computed.color() : color).ToPremultiplied(opacity);

	RenderManager& render_manager = element->GetContext()->GetRenderManager();
	TexturedMeshList mesh_list;
	font_engine_interface->GenerateString(render_manager, font_face_handle, {}, text, offset, text_color, opacity, text_shaping_context, mesh_list);

	if (mesh_list.empty())
		return false;

	Vector<TexturedGeometry> textured_geometry(mesh_list.size());
	for (size_t i = 0; i < textured_geometry.size(); i++)
	{
		textured_geometry[i].geometry = render_manager.MakeGeometry(std::move(mesh_list[i].mesh));
		textured_geometry[i].texture = mesh_list[i].texture;
	}

	element_data = ElementData{
		element_data.paint_area,
		std::move(textured_geometry),
		font_engine_interface->GetVersion(font_face_handle),
	};

	return true;
}